

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

TiXmlElement * __thiscall despot::Parser::GetParameterElement(Parser *this,TiXmlElement *element)

{
  int iVar1;
  TiXmlElement *this_00;
  char *pcVar2;
  string param_type;
  long *local_70;
  char *local_68;
  long local_60 [2];
  string local_50;
  
  this_00 = util::tinyxml::TiXmlNode::FirstChildElement(&element->super_TiXmlNode,"Parameter");
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pcVar2 = util::tinyxml::TiXmlElement::Attribute(this_00,"type");
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_70,0,local_68,0x17632a);
  }
  else {
    pcVar2 = util::tinyxml::TiXmlElement::Attribute(this_00,"type");
    strlen(pcVar2);
    std::__cxx11::string::_M_replace((ulong)&local_70,0,local_68,(ulong)pcVar2);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_70);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Only parameter type \"TBL\" is supported.\n","");
  Ensure(this,iVar1 == 0,&local_50,(TiXmlBase *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return this_00;
}

Assistant:

TiXmlElement* Parser::GetParameterElement(TiXmlElement* element) {
	TiXmlElement* e_Parameter = element->FirstChildElement("Parameter");

	string param_type = "";
	if (e_Parameter->Attribute("type") == NULL)
		param_type = "TBL"; //the default case
	else
		param_type = e_Parameter->Attribute("type");

	Ensure(param_type == "TBL", "Only parameter type \"TBL\" is supported.\n");

	return e_Parameter;
}